

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::End(void)

{
  ImVector<ImGuiWindow_*> *this;
  ImVec2 IVar1;
  int iVar2;
  ImGuiWindow *window;
  ImGuiContext *pIVar3;
  uint uVar4;
  ImGuiWindow **ppIVar5;
  ImGuiViewportP *viewport;
  ImGuiWindow *pIVar6;
  ImVec2 IVar7;
  
  pIVar3 = GImGui;
  window = GImGui->CurrentWindow;
  iVar2 = (GImGui->CurrentWindowStack).Size;
  if (iVar2 < 2) {
    if (GImGui->WithinFrameScopeWithImplicitWindow == true) {
      __assert_fail("(g.CurrentWindowStack.Size > 1) && \"Calling End() too many times!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1a58,"void ImGui::End()");
    }
    if (iVar2 != 1) {
      __assert_fail("g.CurrentWindowStack.Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1a5b,"void ImGui::End()");
    }
  }
  uVar4 = window->Flags;
  if ((((uVar4 & 0x21000000) == 0x1000000) && ((window->field_0x492 & 1) == 0)) &&
     (GImGui->WithinEndChild == false)) {
    __assert_fail("(g.WithinEndChild) && \"Must call EndChild() and not End()!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1a5f,"void ImGui::End()");
  }
  if ((window->DC).CurrentColumns != (ImGuiColumns *)0x0) {
    EndColumns();
    uVar4 = window->Flags;
  }
  if ((uVar4 >> 0x1d & 1) == 0) {
    PopClipRect();
    uVar4 = window->Flags;
  }
  if ((uVar4 >> 0x18 & 1) == 0) {
    LogFinish();
  }
  this = &pIVar3->CurrentWindowStack;
  if (((window->DockNode != (ImGuiDockNode *)0x0) && ((window->field_0x492 & 2) != 0)) &&
     (pIVar6 = window->DockNode->HostWindow, pIVar6 != (ImGuiWindow *)0x0)) {
    IVar1 = (window->DC).CursorMaxPos;
    IVar7.x = (IVar1.x + (window->WindowPadding).x) - (pIVar6->WindowPadding).x;
    IVar7.y = (IVar1.y + (window->WindowPadding).y) - (pIVar6->WindowPadding).y;
    (pIVar6->DC).CursorMaxPos = IVar7;
  }
  ImVector<ImGuiWindow_*>::pop_back(this);
  if ((window->Flags & 0x4000000) != 0) {
    ImVector<ImGuiPopupData>::pop_back(&pIVar3->BeginPopupStack);
  }
  pIVar6 = (ImGuiWindow *)0x0;
  viewport = (ImGuiViewportP *)0x0;
  ErrorCheckBeginEndCompareStacksSize(window,false);
  if (this->Size != 0) {
    ppIVar5 = ImVector<ImGuiWindow_*>::back(this);
    pIVar6 = *ppIVar5;
  }
  SetCurrentWindow(pIVar6);
  if (pIVar3->CurrentWindow != (ImGuiWindow *)0x0) {
    SetCurrentViewport((ImGuiWindow *)pIVar3->CurrentWindow->Viewport,viewport);
    return;
  }
  return;
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Error checking: verify that user hasn't called End() too many times!
    if (g.CurrentWindowStack.Size <= 1 && g.WithinFrameScopeWithImplicitWindow)
    {
        IM_ASSERT_USER_ERROR(g.CurrentWindowStack.Size > 1, "Calling End() too many times!");
        return;
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    // Error checking: verify that user doesn't directly call End() on a child window.
    if ((window->Flags & ImGuiWindowFlags_ChildWindow) && !(window->Flags & ImGuiWindowFlags_DockNodeHost) && !window->DockIsActive)
        IM_ASSERT_USER_ERROR(g.WithinEndChild, "Must call EndChild() and not End()!");

    // Close anything that is open
    if (window->DC.CurrentColumns)
        EndColumns();
    if (!(window->Flags & ImGuiWindowFlags_DockNodeHost))   // Pop inner window clip rectangle
        PopClipRect();

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Docking: report contents sizes to parent to allow for auto-resize
    if (window->DockNode && window->DockTabIsVisible)
        if (ImGuiWindow* host_window = window->DockNode->HostWindow)         // FIXME-DOCK
            host_window->DC.CursorMaxPos = window->DC.CursorMaxPos + window->WindowPadding - host_window->WindowPadding;

    // Pop from window stack
    g.CurrentWindowStack.pop_back();
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    ErrorCheckBeginEndCompareStacksSize(window, false);
    SetCurrentWindow(g.CurrentWindowStack.empty() ? NULL : g.CurrentWindowStack.back());
    if (g.CurrentWindow)
        SetCurrentViewport(g.CurrentWindow, g.CurrentWindow->Viewport);
}